

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O1

bool __thiscall
gl4cts::(anonymous_namespace)::BasicAllFormatsStore::Write<tcu::Vector<int,4>>
          (BasicAllFormatsStore *this,GLenum internalformat,Vector<int,_4> *write_value,
          Vector<int,_4> *expected_value)

{
  CallLogWrapper *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Alloc_hider _Var2;
  _func_int **pp_Var3;
  GLuint program;
  GLint location;
  ostream *poVar4;
  void *__s;
  GLenum e;
  GLenum e_00;
  Vector<int,_4> *v;
  Vector<int,_4> *v_00;
  GLuint unit;
  long lVar5;
  bool bVar6;
  ulong local_260;
  string local_258;
  string local_238;
  Vector<int,_4> *local_218;
  GLuint texture;
  undefined8 local_208;
  undefined2 local_200;
  undefined6 uStack_1fe;
  BasicAllFormatsStore *local_1f0;
  long *local_1e8;
  long local_1d8 [2];
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  ostringstream os;
  
  local_218 = expected_value;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&os);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&os,"#version 420 core\nlayout(",0x19);
  ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
            (&local_258,(void *)(ulong)internalformat,e);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (&os.super_basic_ostream<char,_std::char_traits<char>_>,
                      local_258._M_dataplus._M_p,local_258._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,") writeonly uniform ",0x14);
  paVar1 = &local_238.field_2;
  local_238.field_2._M_allocated_capacity._0_2_ = 0x69;
  local_238._M_string_length = 1;
  local_238._M_dataplus._M_p = (pointer)paVar1;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,paVar1->_M_local_buf,1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,
             "image2D g_image;\nvoid main() {\n  ivec2 coord = ivec2(gl_FragCoord.xy);\n  imageStore(g_image, coord, "
             ,100);
  local_200 = 0x69;
  local_208 = 1;
  _texture = (char *)&local_200;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&local_200,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"vec4",4);
  poVar4 = tcu::operator<<(poVar4,write_value);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,");\n  discard;\n}",0xf);
  if (_texture != (char *)&local_200) {
    operator_delete(_texture,CONCAT62(uStack_1fe,local_200) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar1) {
    operator_delete(local_238._M_dataplus._M_p,
                    CONCAT62(local_238.field_2._M_allocated_capacity._2_6_,
                             local_238.field_2._M_allocated_capacity._0_2_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&os);
  std::ios_base::~ios_base
            ((ios_base *)&os.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
  program = gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::BuildProgram
                      ((ShaderImageLoadStoreBase *)this,
                       "#version 420 core\nlayout(location = 0) in vec4 i_position;\nvoid main() {\n  gl_Position = i_position;\n}"
                       ,(char *)0x0,(char *)0x0,(char *)0x0,(char *)local_1e8,(bool *)0x0);
  if (local_1e8 != local_1d8) {
    operator_delete(local_1e8,local_1d8[0] + 1);
  }
  __s = operator_new(0x1000);
  local_260 = 0;
  memset(__s,0,0x1000);
  this_00 = (CallLogWrapper *)(this + 8);
  local_1f0 = this;
  glu::CallLogWrapper::glGenTextures(this_00,1,&texture);
  bVar6 = false;
  do {
    glu::CallLogWrapper::glBindTexture(this_00,0xde1,texture);
    glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2801,0x2600);
    glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2800,0x2600);
    glu::CallLogWrapper::glTexImage2D(this_00,0xde1,0,internalformat,0x10,0x10,0,0x8d99,0x1404,__s);
    glu::CallLogWrapper::glBindTexture(this_00,0xde1,0);
    glu::CallLogWrapper::glViewport(this_00,0,0,0x10,0x10);
    glu::CallLogWrapper::glUseProgram(this_00,program);
    unit = (GLuint)local_260;
    glu::CallLogWrapper::glBindImageTexture(this_00,unit,texture,0,'\0',0,0x88b9,internalformat);
    glu::CallLogWrapper::glBindVertexArray(this_00,*(GLuint *)(local_1f0 + 0x28));
    glu::CallLogWrapper::glDrawArrays(this_00,5,0,4);
    glu::CallLogWrapper::glBindTexture(this_00,0xde1,texture);
    glu::CallLogWrapper::glMemoryBarrier(this_00,0x100);
    glu::CallLogWrapper::glGetTexImage(this_00,0xde1,0,0x8d99,0x1404,__s);
    lVar5 = 0;
    do {
      if ((((*(int *)((long)__s + lVar5) != local_218->m_data[0]) ||
           (*(int *)((long)__s + lVar5 + 4) != local_218->m_data[1])) ||
          (*(int *)((long)__s + lVar5 + 8) != local_218->m_data[2])) ||
         (*(int *)((long)__s + lVar5 + 0xc) != local_218->m_data[3])) {
        glu::CallLogWrapper::glDeleteTextures(this_00,1,&texture);
        glu::CallLogWrapper::glUseProgram(this_00,0);
        glu::CallLogWrapper::glDeleteProgram(this_00,program);
        local_1b8 = *(undefined8 *)((long)__s + lVar5);
        uStack_1b0 = ((undefined8 *)((long)__s + lVar5))[1];
        ShaderImageLoadStoreBase::ToString<tcu::Vector<int,4>>((string *)&os,&local_1b8,v);
        pp_Var3 = os.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream;
        local_1c8 = *(undefined8 *)local_218->m_data;
        uStack_1c0 = *(undefined8 *)(local_218->m_data + 2);
        ShaderImageLoadStoreBase::ToString<tcu::Vector<int,4>>(&local_258,&local_1c8,v_00);
        _Var2._M_p = local_258._M_dataplus._M_p;
        ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
                  (&local_238,(void *)(ulong)internalformat,e_00);
        gl4cts::anon_unknown_0::Output
                  ("Value is: %s. Value should be: %s. Format is: %s. Unit is: %d.\n",pp_Var3,
                   _Var2._M_p,local_238._M_dataplus._M_p,local_260);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != &local_238.field_2) {
          operator_delete(local_238._M_dataplus._M_p,
                          CONCAT62(local_238.field_2._M_allocated_capacity._2_6_,
                                   local_238.field_2._M_allocated_capacity._0_2_) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_258._M_dataplus._M_p != &local_258.field_2) {
          operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
        }
        if (os.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
            (_func_int **)&os.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
          operator_delete(os.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream,
                          os.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1);
        }
        goto LAB_00998dd4;
      }
      lVar5 = lVar5 + 0x10;
    } while (lVar5 != 0x1000);
    if (unit != 7) {
      location = glu::CallLogWrapper::glGetUniformLocation(this_00,program,"g_image");
      glu::CallLogWrapper::glUniform1i(this_00,location,unit + 1);
    }
    bVar6 = 6 < unit;
    local_260 = (ulong)(unit + 1);
  } while (unit + 1 != 8);
  glu::CallLogWrapper::glDeleteTextures(this_00,1,&texture);
  glu::CallLogWrapper::glUseProgram(this_00,0);
  glu::CallLogWrapper::glDeleteProgram(this_00,program);
LAB_00998dd4:
  operator_delete(__s,0x1000);
  return bVar6;
}

Assistant:

bool Write(GLenum internalformat, const T& write_value, const T& expected_value)
	{
		const char* src_vs = "#version 420 core" NL "layout(location = 0) in vec4 i_position;" NL "void main() {" NL
							 "  gl_Position = i_position;" NL "}";
		const GLuint   program = BuildProgram(src_vs, NULL, NULL, NULL, GenFS(internalformat, write_value).c_str());
		const int	  kSize   = 16;
		std::vector<T> data(kSize * kSize);
		GLuint		   texture;
		glGenTextures(1, &texture);

		for (GLuint unit = 0; unit < 8; ++unit)
		{
			glBindTexture(GL_TEXTURE_2D, texture);
			glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
			glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
			glTexImage2D(GL_TEXTURE_2D, 0, internalformat, kSize, kSize, 0, Format<T>(), Type<T>(), &data[0]);
			glBindTexture(GL_TEXTURE_2D, 0);

			glViewport(0, 0, kSize, kSize);
			glUseProgram(program);
			glBindImageTexture(unit, texture, 0, GL_FALSE, 0, GL_WRITE_ONLY, internalformat);
			glBindVertexArray(m_vao);
			glDrawArrays(GL_TRIANGLE_STRIP, 0, 4);

			glBindTexture(GL_TEXTURE_2D, texture);
			glMemoryBarrier(GL_TEXTURE_UPDATE_BARRIER_BIT);
			glGetTexImage(GL_TEXTURE_2D, 0, Format<T>(), Type<T>(), &data[0]);

			for (int i = 0; i < kSize * kSize; ++i)
			{
				if (!Equal(data[i], expected_value, internalformat))
				{
					glDeleteTextures(1, &texture);
					glUseProgram(0);
					glDeleteProgram(program);
					Output("Value is: %s. Value should be: %s. Format is: %s. Unit is: %d.\n",
						   ToString(data[i]).c_str(), ToString(expected_value).c_str(),
						   FormatEnumToString(internalformat).c_str(), unit);
					return false;
				}
			}

			if (unit < 7)
			{
				glUniform1i(glGetUniformLocation(program, "g_image"), static_cast<GLint>(unit + 1));
			}
		}

		glDeleteTextures(1, &texture);
		glUseProgram(0);
		glDeleteProgram(program);

		return true;
	}